

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

int co_poll_inner(stCoEpoll_t *ctx,pollfd *fds,nfds_t nfds,int timeout,poll_pfn_t pollfunc)

{
  uint *puVar1;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  int iVar2;
  int iVar3;
  stTimeoutItem_t *apItem;
  stTimeoutItem_t *psVar4;
  stTimeoutItemLink_t *psVar5;
  int *piVar6;
  uint uVar7;
  unsigned_long_long allNow;
  long lVar8;
  long lVar9;
  long lVar10;
  nfds_t nVar11;
  long in_FS_OFFSET;
  timeval now;
  stPollItem_t arr [2];
  timeval local_108;
  stTimeoutItemLink_t local_f8 [12];
  
  if (timeout == 0) {
    iVar3 = (*pollfunc)(fds,nfds,0);
    return iVar3;
  }
  uVar7 = 0x7fffffff;
  if ((uint)timeout < 0x7fffffff) {
    uVar7 = timeout;
  }
  iVar3 = ctx->iEpollFd;
  lVar8 = *(long *)(in_FS_OFFSET + -0x10);
  if (lVar8 == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = *(long *)(lVar8 + -8 + (long)*(int *)(lVar8 + 0x400) * 8);
  }
  apItem = (stTimeoutItem_t *)calloc(1,0x68);
  *(int *)((long)&apItem[1].ullExpireTime + 4) = iVar3;
  psVar4 = (stTimeoutItem_t *)calloc(nfds,8);
  apItem[1].pPrev = psVar4;
  apItem[1].pNext = (stTimeoutItem_t *)nfds;
  if ((nfds < 2) && (*(char *)(lVar9 + 0x9c) == '\0')) {
    psVar5 = local_f8;
    apItem[1].pLink = psVar5;
  }
  else {
    psVar5 = (stTimeoutItemLink_t *)malloc(nfds * 0x60);
    apItem[1].pLink = psVar5;
  }
  lVar9 = 0;
  memset(psVar5,0,nfds * 0x60);
  apItem->pfnProcess = OnPollProcessEvent;
  apItem->pArg = *(void **)(lVar8 + -8 + (long)*(int *)(lVar8 + 0x400) * 8);
  if (nfds != 0) {
    lVar10 = 0x50;
    lVar8 = 0;
    lVar9 = 0;
    nVar11 = nfds;
    do {
      psVar5 = apItem[1].pLink;
      *(long *)((long)&psVar5[-1].head + lVar10) = (long)&(apItem[1].pPrev)->pPrev + lVar8;
      *(stTimeoutItem_t **)((long)psVar5 + lVar10 + -8) = apItem;
      *(code **)((long)&psVar5[-3].head + lVar10) = OnPollPreparePfn;
      if (-1 < *(int *)((long)&fds->fd + lVar8)) {
        puVar1 = (uint *)((long)&psVar5->head + lVar10);
        *(uint **)(puVar1 + 1) = puVar1 + -0x14;
        *puVar1 = *(ushort *)((long)&fds->events + lVar8) & 0x15d;
        iVar2 = co_epoll_ctl(iVar3,1,*(int *)((long)&fds->fd + lVar8),
                             (epoll_event *)((long)&psVar5->head + lVar10));
        if ((((iVar2 < 0) && (piVar6 = __errno_location(), pollfunc != (poll_pfn_t)0x0)) &&
            (nfds == 1)) && (*piVar6 == 1)) {
          if (apItem[1].pLink != local_f8) {
            free(apItem[1].pLink);
            apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
          }
          free(apItem[1].pPrev);
          free(apItem);
          iVar3 = (*pollfunc)(fds,1,uVar7);
          return iVar3;
        }
        lVar9 = lVar9 + 1;
      }
      lVar8 = lVar8 + 8;
      lVar10 = lVar10 + 0x60;
      nVar11 = nVar11 - 1;
    } while (nVar11 != 0);
  }
  local_108.tv_sec = 0;
  local_108.tv_usec = 0;
  gettimeofday(&local_108,(__timezone_ptr_t)0x0);
  allNow = local_108.tv_usec / 1000 + local_108.tv_sec * 1000;
  apItem->ullExpireTime = uVar7 + allNow;
  iVar2 = AddTimeout(ctx->pTimeout,apItem,allNow);
  if (iVar2 == 0) {
    *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + lVar9;
    lVar8 = *(long *)(in_FS_OFFSET + -0x10);
    iVar2 = *(int *)(lVar8 + 0x400);
    pending_co = *(stCoRoutine_t **)(lVar8 + -0x10 + (long)iVar2 * 8);
    curr = *(stCoRoutine_t **)(lVar8 + -8 + (long)iVar2 * 8);
    *(int *)(lVar8 + 0x400) = iVar2 + -1;
    co_swap(curr,pending_co);
    *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) - lVar9;
    iVar2 = *(int *)&apItem[1].pfnPrepare;
  }
  else {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    iVar2 = -1;
  }
  RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(apItem);
  if (nfds != 0) {
    lVar8 = 0x50;
    nVar11 = 0;
    do {
      if (-1 < fds[nVar11].fd) {
        co_epoll_ctl(iVar3,2,fds[nVar11].fd,(epoll_event *)((long)&(apItem[1].pLink)->head + lVar8))
        ;
      }
      fds[nVar11].revents = *(short *)((long)&(apItem[1].pPrev)->pPrev + nVar11 * 8 + 6);
      nVar11 = nVar11 + 1;
      lVar8 = lVar8 + 0x60;
    } while (nfds != nVar11);
  }
  if (apItem[1].pLink != local_f8) {
    free(apItem[1].pLink);
    apItem[1].pLink = (stTimeoutItemLink_t *)0x0;
  }
  free(apItem[1].pPrev);
  free(apItem);
  return iVar2;
}

Assistant:

int co_poll_inner( stCoEpoll_t *ctx,struct pollfd fds[], nfds_t nfds, int timeout, poll_pfn_t pollfunc)
{
    if (timeout == 0)
	{
		return pollfunc(fds, nfds, timeout);
	}
	if (timeout < 0)
	{
		timeout = INT_MAX;
	}
	int epfd = ctx->iEpollFd;
	stCoRoutine_t* self = co_self();

	//1.struct change
	stPoll_t& arg = *((stPoll_t*)malloc(sizeof(stPoll_t)));
	memset( &arg,0,sizeof(arg) );

	arg.iEpollFd = epfd;
	arg.fds = (pollfd*)calloc(nfds, sizeof(pollfd));
	arg.nfds = nfds;

	stPollItem_t arr[2];
	if( nfds < sizeof(arr) / sizeof(arr[0]) && !self->cIsShareStack)
	{
		arg.pPollItems = arr;
	}	
	else
	{
		arg.pPollItems = (stPollItem_t*)malloc( nfds * sizeof( stPollItem_t ) );
	}
	memset( arg.pPollItems,0,nfds * sizeof(stPollItem_t) );

	arg.pfnProcess = OnPollProcessEvent;
	arg.pArg = GetCurrCo( co_get_curr_thread_env() );
	
	size_t num_active = 0;
	//2. add epoll
	for(nfds_t i=0;i<nfds;i++)
	{
		arg.pPollItems[i].pSelf = arg.fds + i;
		arg.pPollItems[i].pPoll = &arg;

		arg.pPollItems[i].pfnPrepare = OnPollPreparePfn;
		struct epoll_event &ev = arg.pPollItems[i].stEvent;

		if( fds[i].fd > -1 )
		{
			ev.data.ptr = arg.pPollItems + i;
			ev.events = PollEvent2Epoll( fds[i].events );

			int ret = co_epoll_ctl( epfd,EPOLL_CTL_ADD, fds[i].fd, &ev );
			if (ret < 0 && errno == EPERM && nfds == 1 && pollfunc != NULL)
			{
				if( arg.pPollItems != arr )
				{
					free( arg.pPollItems );
					arg.pPollItems = NULL;
				}
				free(arg.fds);
				free(&arg);
				return pollfunc(fds, nfds, timeout);
			}
			num_active++;
		}
		//if fail,the timeout would work
	}

	//3.add timeout

	unsigned long long now = GetTickMS();
	arg.ullExpireTime = now + timeout;
	int ret = AddTimeout( ctx->pTimeout,&arg,now );
	int iRaiseCnt = 0;
	if( ret != 0 && ret!=-1){
		co_log_err("CO_ERR: AddTimeout ret %d now %lld timeout %d arg.ullExpireTime %lld",
				ret,now,timeout,arg.ullExpireTime);
		errno = EINVAL;
		iRaiseCnt = -1;

	}
    else
	{
		_num_co_routines_active += num_active;
		co_yield_env( co_get_curr_thread_env() );
		_num_co_routines_active -= num_active;
		iRaiseCnt = arg.iRaiseCnt;
	}

    {
		//clear epoll status and memory
		RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>( &arg );
		for(nfds_t i = 0;i < nfds;i++)
		{
			int fd = fds[i].fd;
			if( fd > -1 )
			{
				co_epoll_ctl( epfd,EPOLL_CTL_DEL,fd,&arg.pPollItems[i].stEvent );
			}
			fds[i].revents = arg.fds[i].revents;
		}


		if( arg.pPollItems != arr )
		{
			free( arg.pPollItems );
			arg.pPollItems = NULL;
		}

		free(arg.fds);
		free(&arg);
	}

	return iRaiseCnt;
}